

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::SamHeaderValidator::AddWarning(SamHeaderValidator *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long in_RDI;
  value_type *in_stack_ffffffffffffff88;
  RuleToken *__lhs;
  RuleToken *in_stack_ffffffffffffffb0;
  RuleToken *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x20);
  __lhs = (RuleToken *)&stack0xffffffffffffffb0;
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(__lhs,__rhs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__rhs,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void SamHeaderValidator::AddWarning(const std::string& message)
{
    m_warningMessages.push_back(WARN_PREFIX + message + NEWLINE);
}